

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeUpper(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,int i,
             number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *newUpper,bool scale)

{
  uint *puVar1;
  int iVar2;
  pointer pnVar3;
  bool bVar4;
  undefined7 in_register_00000009;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_f8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  uint local_a8 [2];
  uint auStack_a0 [2];
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint local_88 [2];
  int local_80;
  undefined1 local_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  if ((int)CONCAT71(in_register_00000009,scale) == 0) {
    pnVar3 = (this->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .up.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_f8.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pnVar3[i].m_backend.data._M_elems + 8)
    ;
    local_f8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[i].m_backend.data;
    local_f8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pnVar3[i].m_backend.data._M_elems + 2);
    puVar1 = pnVar3[i].m_backend.data._M_elems + 4;
    local_f8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_f8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_f8.m_backend.exp = pnVar3[i].m_backend.exp;
    local_f8.m_backend.neg = pnVar3[i].m_backend.neg;
    local_f8.m_backend.fpclass = pnVar3[i].m_backend.fpclass;
    local_f8.m_backend.prec_elem = pnVar3[i].m_backend.prec_elem;
  }
  else {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::upperUnscaled(&local_f8,
                    &this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ,i);
  }
  bVar4 = boost::multiprecision::operator!=(newUpper,&local_f8);
  if (bVar4) {
    forceRecompNonbasicValue(this);
    pnVar3 = (this->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .up.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_f8.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pnVar3[i].m_backend.data._M_elems + 8)
    ;
    local_f8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[i].m_backend.data;
    local_f8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pnVar3[i].m_backend.data._M_elems + 2);
    puVar1 = pnVar3[i].m_backend.data._M_elems + 4;
    local_f8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_f8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    iVar2 = pnVar3[i].m_backend.exp;
    bVar4 = pnVar3[i].m_backend.neg;
    local_b8._0_4_ = pnVar3[i].m_backend.fpclass;
    local_b8._4_4_ = pnVar3[i].m_backend.prec_elem;
    uStack_b0 = 0;
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::changeUpper(&this->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,i,newUpper,scale);
    if (NO_PROBLEM <
        (this->
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thestatus) {
      pnVar3 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_48 = *(undefined8 *)(pnVar3[i].m_backend.data._M_elems + 8);
      local_68 = *(undefined8 *)&pnVar3[i].m_backend.data;
      uStack_60 = *(undefined8 *)(pnVar3[i].m_backend.data._M_elems + 2);
      puVar1 = pnVar3[i].m_backend.data._M_elems + 4;
      local_58 = *(undefined8 *)puVar1;
      uStack_50 = *(undefined8 *)(puVar1 + 2);
      local_40 = pnVar3[i].m_backend.exp;
      local_3c = pnVar3[i].m_backend.neg;
      local_38._0_4_ = pnVar3[i].m_backend.fpclass;
      local_38._4_4_ = pnVar3[i].m_backend.prec_elem;
      local_a8[0] = local_f8.m_backend.data._M_elems[0];
      local_a8[1] = local_f8.m_backend.data._M_elems[1];
      auStack_a0[0] = local_f8.m_backend.data._M_elems[2];
      auStack_a0[1] = local_f8.m_backend.data._M_elems[3];
      local_98 = local_f8.m_backend.data._M_elems[4];
      uStack_94 = local_f8.m_backend.data._M_elems[5];
      uStack_90 = local_f8.m_backend.data._M_elems[6];
      uStack_8c = local_f8.m_backend.data._M_elems[7];
      local_88[0] = local_f8.m_backend.data._M_elems[8];
      local_88[1] = local_f8.m_backend.data._M_elems[9];
      local_78 = (undefined4)local_b8;
      uStack_74 = local_b8._4_4_;
      local_80 = iVar2;
      local_7c = bVar4;
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x6a])(this,i);
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x77])(this);
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::changeUpper(int i, const R& newUpper, bool scale)
{
   if(newUpper != (scale ? this->upperUnscaled(i) : this->upper(i)))
   {
      forceRecompNonbasicValue();

      R oldUpper = this->upper(i);
      SPxLPBase<R>::changeUpper(i, newUpper, scale);

      if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
      {
         changeUpperStatus(i, this->upper(i), oldUpper);
         unInit();
      }
   }
}